

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000185db0 = 0x2d2d2d2d2d2d2d;
    uRam0000000000185db7._0_1_ = '-';
    uRam0000000000185db7._1_1_ = '-';
    uRam0000000000185db7._2_1_ = '-';
    uRam0000000000185db7._3_1_ = '-';
    uRam0000000000185db7._4_1_ = '-';
    uRam0000000000185db7._5_1_ = '-';
    uRam0000000000185db7._6_1_ = '-';
    uRam0000000000185db7._7_1_ = '-';
    DAT_00185da0 = '-';
    DAT_00185da0_1._0_1_ = '-';
    DAT_00185da0_1._1_1_ = '-';
    DAT_00185da0_1._2_1_ = '-';
    DAT_00185da0_1._3_1_ = '-';
    DAT_00185da0_1._4_1_ = '-';
    DAT_00185da0_1._5_1_ = '-';
    DAT_00185da0_1._6_1_ = '-';
    uRam0000000000185da8 = 0x2d2d2d2d2d2d2d;
    DAT_00185daf = 0x2d;
    DAT_00185d90 = '-';
    DAT_00185d90_1._0_1_ = '-';
    DAT_00185d90_1._1_1_ = '-';
    DAT_00185d90_1._2_1_ = '-';
    DAT_00185d90_1._3_1_ = '-';
    DAT_00185d90_1._4_1_ = '-';
    DAT_00185d90_1._5_1_ = '-';
    DAT_00185d90_1._6_1_ = '-';
    uRam0000000000185d98._0_1_ = '-';
    uRam0000000000185d98._1_1_ = '-';
    uRam0000000000185d98._2_1_ = '-';
    uRam0000000000185d98._3_1_ = '-';
    uRam0000000000185d98._4_1_ = '-';
    uRam0000000000185d98._5_1_ = '-';
    uRam0000000000185d98._6_1_ = '-';
    uRam0000000000185d98._7_1_ = '-';
    DAT_00185d80 = '-';
    DAT_00185d80_1._0_1_ = '-';
    DAT_00185d80_1._1_1_ = '-';
    DAT_00185d80_1._2_1_ = '-';
    DAT_00185d80_1._3_1_ = '-';
    DAT_00185d80_1._4_1_ = '-';
    DAT_00185d80_1._5_1_ = '-';
    DAT_00185d80_1._6_1_ = '-';
    uRam0000000000185d88._0_1_ = '-';
    uRam0000000000185d88._1_1_ = '-';
    uRam0000000000185d88._2_1_ = '-';
    uRam0000000000185d88._3_1_ = '-';
    uRam0000000000185d88._4_1_ = '-';
    uRam0000000000185d88._5_1_ = '-';
    uRam0000000000185d88._6_1_ = '-';
    uRam0000000000185d88._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000185d78._0_1_ = '-';
    uRam0000000000185d78._1_1_ = '-';
    uRam0000000000185d78._2_1_ = '-';
    uRam0000000000185d78._3_1_ = '-';
    uRam0000000000185d78._4_1_ = '-';
    uRam0000000000185d78._5_1_ = '-';
    uRam0000000000185d78._6_1_ = '-';
    uRam0000000000185d78._7_1_ = '-';
    DAT_00185dbf = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}